

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_subgraph.cpp
# Opt level: O0

void __thiscall
Disa::Adjacency_Subgraph::Adjacency_Subgraph
          (Adjacency_Subgraph *this,Adjacency_Graph<false> *parent_graph,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *i_partition_local_global,
          size_t extra_levels)

{
  pointer *this_00;
  pointer puVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *parent_graph_00;
  bool bVar2;
  size_t sVar3;
  source_location *psVar4;
  source_location *psVar5;
  ostream *poVar6;
  size_type size_vertex;
  reference pvVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_200;
  anon_class_8_1_42383e23_for__M_pred not_in_subgraph;
  unsigned_long *i_global_vertex;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  unsigned_long local_1d0;
  undefined1 local_1c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> i_global_local;
  size_t i_local_vertex;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined **local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  unsigned_long *local_110;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_108;
  undefined **local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined **local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  undefined1 local_80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> unique_check;
  hash<Disa::Adjacency_Graph<false>_> local_29;
  size_t local_28;
  size_t extra_levels_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *i_partition_local_global_local;
  Adjacency_Graph<false> *parent_graph_local;
  Adjacency_Subgraph *this_local;
  
  unique_check.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &unique_check.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_28 = extra_levels;
  extra_levels_local = (size_t)i_partition_local_global;
  i_partition_local_global_local = &parent_graph->vertex_adjacent_list;
  parent_graph_local = (Adjacency_Graph<false> *)this;
  Adjacency_Graph<false>::Adjacency_Graph((Adjacency_Graph<false> *)this_00);
  sVar3 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    (&local_29,(Adjacency_Graph<false> *)this_00);
  Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)this_00);
  this->hash_parent = sVar3;
  Adjacency_Graph<false>::Adjacency_Graph(&this->graph);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->i_local_global);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->level_set_value);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  local_88._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)extra_levels_local);
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)extra_levels_local);
  local_98 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::back_inserter<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  local_b0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::
             unique_copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (local_88,local_90,
                        (back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )local_98);
  psVar4 = (source_location *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  psVar5 = (source_location *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)extra_levels_local);
  if (psVar4 != psVar5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_d8 = &PTR_s__workspace_llm4binary_github_lic_001c1970;
    console_format_abi_cxx11_(&local_d0,(Disa *)0x0,(Log_Level)&local_d8,psVar5);
    poVar6 = std::operator<<(poVar6,(string *)&local_d0);
    poVar6 = std::operator<<(poVar6,"Partition vertices are not unique.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_d0);
    exit(1);
  }
  psVar4 = (source_location *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)extra_levels_local);
  psVar5 = (source_location *)
           Adjacency_Graph<false>::size_vertex
                     ((Adjacency_Graph<false> *)i_partition_local_global_local);
  if (psVar5 < psVar4) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_100 = &PTR_s__workspace_llm4binary_github_lic_001c1988;
    console_format_abi_cxx11_(&local_f8,(Disa *)0x0,Error,psVar5);
    poVar6 = std::operator<<(poVar6,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6,"Partition size is bigger than graph vertex size.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_f8);
    exit(1);
  }
  local_108._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)extra_levels_local);
  local_110 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)extra_levels_local
                        );
  local_118 = i_partition_local_global_local;
  bVar2 = std::
          any_of<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__0>
                    (local_108,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_110,(anon_class_8_1_73b1e377_for__M_pred)i_partition_local_global_local
                    );
  if (!bVar2) {
    sVar3 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                      ((hash<Disa::Adjacency_Graph<false>_> *)((long)&i_local_vertex + 7),
                       (Adjacency_Graph<false> *)i_partition_local_global_local);
    this->hash_parent = sVar3;
    Adjacency_Graph<false>::operator=
              (&this->graph,(Adjacency_Graph<false> *)i_partition_local_global_local);
    size_vertex = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             extra_levels_local);
    reserve(this,size_vertex,0);
    i_global_local.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar3 = Adjacency_Graph<false>::size_vertex
                      ((Adjacency_Graph<false> *)i_partition_local_global_local);
    local_1d0 = std::numeric_limits<unsigned_long>::max();
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&__range1 + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1c8,sVar3,&local_1d0,
               (allocator<unsigned_long> *)((long)&__range1 + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&__range1 + 7));
    sVar3 = extra_levels_local;
    __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)extra_levels_local)
    ;
    i_global_vertex =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar3);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        (&__end1,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&i_global_vertex);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      not_in_subgraph.i_global_local =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator*(&__end1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->i_local_global,(value_type_conflict *)not_in_subgraph.i_global_local);
      puVar1 = i_global_local.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1c8,
                          (size_type)
                          ((not_in_subgraph.i_global_local)->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start);
      *pvVar7 = (value_type)puVar1;
      i_global_local.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)i_global_local.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 1);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1);
    }
    local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8;
    local_200 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    Adjacency_Graph<false>::
    erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>
              (&this->graph,
               (anon_class_8_1_42383e23_for__M_pred)
               local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    parent_graph_00 = i_partition_local_global_local;
    sVar3 = local_28;
    if (local_28 != 0) {
      std::
      make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                (&local_218);
      update_levels(this,(Adjacency_Graph<false> *)parent_graph_00,sVar3,
                    (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                    &local_218);
      std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
                ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                 &local_218);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1c8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
  local_140 = &PTR_s__workspace_llm4binary_github_lic_001c19a0;
  console_format_abi_cxx11_(&local_138,(Disa *)0x0,(Log_Level)&local_140,psVar5);
  poVar6 = std::operator<<(poVar6,(string *)&local_138);
  sVar3 = Adjacency_Graph<false>::size_vertex
                    ((Adjacency_Graph<false> *)i_partition_local_global_local);
  std::__cxx11::to_string(&local_1a0,sVar3);
  std::operator+(&local_180,"A global vertex is not in the parsed parent graph range [0, ",
                 &local_1a0);
  std::operator+(&local_160,&local_180,").");
  poVar6 = std::operator<<(poVar6,(string *)&local_160);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_138);
  exit(1);
}

Assistant:

Adjacency_Subgraph::Adjacency_Subgraph(const Adjacency_Graph<false>& parent_graph,
                                       const std::vector<std::size_t>& i_partition_local_global,
                                       const std::size_t extra_levels) {
#ifdef DISA_DEBUG
  std::vector<std::size_t> unique_check;
  std::unique_copy(i_partition_local_global.begin(), i_partition_local_global.end(), std::back_inserter(unique_check));
  ASSERT(unique_check.size() == i_partition_local_global.size(), "Partition vertices are not unique.");
  ASSERT(i_partition_local_global.size() <= parent_graph.size_vertex(),
         "Partition size is bigger than graph vertex size.");
  ASSERT(
  !std::any_of(i_partition_local_global.begin(), i_partition_local_global.end(),
               [&](const std::size_t i_global) { return i_global >= parent_graph.size_vertex(); }),
  "A global vertex is not in the parsed parent graph range [0, " + std::to_string(parent_graph.size_vertex()) + ").");
#endif

  hash_parent = std::hash<Adjacency_Graph<false>>{}(parent_graph);
  graph = parent_graph;
  reserve(i_partition_local_global.size());

  // Copy the contents of the graph into the sub-graph and set up axillary containers.
  std::size_t i_local_vertex = 0;
  std::vector<std::size_t> i_global_local(parent_graph.size_vertex(), std::numeric_limits<std::size_t>::max());
  FOR_EACH(i_global_vertex, i_partition_local_global) {
    i_local_global.push_back(i_global_vertex);
    i_global_local[i_global_vertex] = i_local_vertex;
    ++i_local_vertex;
  }

  // Remove vertices not in this subgraph.
  auto not_in_subgraph = [&](const std::size_t& vertex) {
    return i_global_local[vertex] == std::numeric_limits<std::size_t>::max();
  };
  graph.erase_if(not_in_subgraph);

  // Add back additional levels as needed.
  if(extra_levels != 0)
    update_levels(parent_graph, extra_levels, std::make_shared<std::vector<std::size_t>>(i_global_local));
}